

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowTabBar::mouseReleaseEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  DragState *pDVar1;
  int *piVar2;
  
  if ((((*(long *)(this + 0x30) != 0) && (*(int *)(*(long *)(this + 0x30) + 4) != 0)) &&
      (*(long *)(this + 0x38) != 0)) && (*(int *)(e + 0x40) == 1)) {
    pDVar1 = (*(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8))->state;
    if ((pDVar1 != (DragState *)0x0) && (pDVar1->dragging == true)) {
      QDockWidgetPrivate::endDrag
                (*(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8),LocationChange);
    }
    piVar2 = *(int **)(this + 0x30);
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
  }
  QTabBar::mouseReleaseEvent((QTabBar *)this,e);
  return;
}

Assistant:

void QMainWindowTabBar::mouseReleaseEvent(QMouseEvent *e)
{
    if (draggingDock && e->button() == Qt::LeftButton) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging)
            dockPriv->endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);

        draggingDock = nullptr;
    }
    QTabBar::mouseReleaseEvent(e);
}